

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t completed,size_t total)

{
  cmCTestRunTest *pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  _Setw _Var5;
  ostream *poVar6;
  char *pcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar8;
  reference pvVar9;
  string *psVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  ulong uVar11;
  bool local_ce1;
  duration<double,_std::ratio<1L,_1L>_> local_bd0;
  rep_conflict local_bc8;
  duration<double,_std::ratio<1L,_1L>_> local_bc0;
  int local_bb4;
  duration<long,_std::ratio<3600L,_1L>_> local_bb0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_ba8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_ba0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_b98;
  duration<double,_std::ratio<1L,_1L>_> local_b90;
  duration<double,_std::ratio<1L,_1L>_> stop_timeout;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_b80;
  time_point stop_time;
  cmDuration timeout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  string local_b30 [32];
  ostringstream local_b10 [8];
  ostringstream cmCTestLog_msg_5;
  undefined1 local_998 [40];
  string local_970 [32];
  ostringstream local_950 [8];
  ostringstream cmCTestLog_msg_4;
  undefined1 local_7d8 [16];
  string *file;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_790 [8];
  ostringstream cmCTestLog_msg_3;
  string local_618 [8];
  string msg_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args;
  undefined1 local_5c8 [8];
  ostringstream cmCTestLog_msg_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  reference local_430;
  string *failedDep;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_408 [8];
  string msg;
  undefined1 local_3e0 [16];
  string local_3d0 [32];
  undefined1 local_3b0 [8];
  ostringstream cmCTestLog_msg_1;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string testName;
  undefined1 local_1a0 [8];
  ostringstream cmCTestLog_msg;
  size_t total_local;
  size_t completed_local;
  cmCTestRunTest *this_local;
  
  this->TotalNumberOfTests = total;
  bVar3 = cmCTest::GetTestProgressOutput(this->CTest);
  if (bVar3) {
    GetTestPrefix_abi_cxx11_(&local_238,this,completed,total);
    std::operator+(&local_218,&local_238,&this->TestProperties->Name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                   &local_218,"\n");
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::operator<<((ostream *)local_3b0,(string *)local_1f8);
    pcVar2 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1ae,pcVar7,false);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::__cxx11::string::~string((string *)local_1f8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    iVar4 = getNumWidth(total);
    _Var5 = std::setw(iVar4 * 2 + 8);
    poVar6 = std::operator<<((ostream *)local_1a0,_Var5);
    poVar6 = std::operator<<(poVar6,"Start ");
    iVar4 = cmCTestTestHandler::GetMaxIndex(this->TestHandler);
    iVar4 = getNumWidth((long)iVar4);
    _Var5 = std::setw(iVar4);
    poVar6 = std::operator<<(poVar6,_Var5);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->TestProperties->Index);
    poVar6 = std::operator<<(poVar6,": ");
    poVar6 = std::operator<<(poVar6,(string *)this->TestProperties);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar2 = this->CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1aa,pcVar7,false);
    std::__cxx11::string::~string((string *)(testName.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  }
  std::__cxx11::string::clear();
  (this->TestResult).Properties = this->TestProperties;
  local_3e0._8_8_ = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
  (this->TestResult).ExecutionTime.__r = (rep_conflict)local_3e0._8_8_;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  (this->TestResult).TestCount = this->TestProperties->Index;
  std::__cxx11::string::operator=((string *)&this->TestResult,(string *)this->TestProperties);
  std::__cxx11::string::operator=
            ((string *)&(this->TestResult).Path,(string *)&this->TestProperties->Directory);
  if ((this->TestProperties->Disabled & 1U) == 0) {
    std::__cxx11::string::operator=
              ((string *)&(this->TestResult).CompletionStatus,"Failed to start");
    (this->TestResult).Status = 8;
    bVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->FailedDependencies);
    if (bVar3) {
      ComputeArguments(this);
      this_00 = &this->TestProperties->Args;
      sVar8 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(this_00);
      if (1 < sVar8) {
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_00,1);
        bVar3 = std::operator==(pvVar9,"NOT_AVAILABLE");
        if (bVar3) {
          pcVar1 = (cmCTestRunTest *)(&msg_1.field_2._M_allocated_capacity + 1);
          std::make_unique<cmProcess,cmCTestRunTest&>(pcVar1);
          std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator=
                    (&this->TestProcess,
                     (unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)pcVar1);
          std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
                    ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)pcVar1);
          std::__cxx11::string::string(local_618);
          cmCTest::GetConfigType_abi_cxx11_(this->CTest);
          uVar11 = std::__cxx11::string::empty();
          if ((uVar11 & 1) == 0) {
            std::__cxx11::string::operator=(local_618,"Test not available in configuration \"");
            psVar10 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
            std::__cxx11::string::operator+=(local_618,(string *)psVar10);
            std::__cxx11::string::operator+=(local_618,"\".");
          }
          else {
            std::__cxx11::string::operator=(local_618,"Test not available without configuration.");
            std::__cxx11::string::operator+=(local_618,"  (Missing \"-C <config>\"?)");
          }
          poVar6 = std::operator<<(this->TestHandler->LogFile,local_618);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_790);
          poVar6 = std::operator<<((ostream *)local_790,local_618);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar2 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                       ,0x1e9,pcVar7,false);
          std::__cxx11::string::~string((string *)&__range1);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_790);
          std::__cxx11::string::operator=((string *)&(this->TestResult).Output,local_618);
          std::__cxx11::string::clear();
          std::__cxx11::string::operator=
                    ((string *)&(this->TestResult).CompletionStatus,"Missing Configuration");
          (this->TestResult).Status = 0;
          std::__cxx11::string::~string(local_618);
          return false;
        }
      }
      this_01 = &this->TestProperties->RequiredFiles;
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_01);
      file = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_01);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&file), bVar3) {
        local_7d8._8_8_ =
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
        bVar3 = cmsys::SystemTools::FileExists((string *)local_7d8._8_8_);
        if (!bVar3) {
          std::make_unique<cmProcess,cmCTestRunTest&>((cmCTestRunTest *)local_7d8);
          std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator=
                    (&this->TestProcess,
                     (unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)local_7d8);
          std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
                    ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)local_7d8);
          poVar6 = std::operator<<(this->TestHandler->LogFile,"Unable to find required file: ");
          poVar6 = std::operator<<(poVar6,(string *)local_7d8._8_8_);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::ostringstream(local_950);
          poVar6 = std::operator<<((ostream *)local_950,"Unable to find required file: ");
          poVar6 = std::operator<<(poVar6,(string *)local_7d8._8_8_);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          pcVar2 = this->CTest;
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                       ,0x1f9,pcVar7,false);
          std::__cxx11::string::~string(local_970);
          std::__cxx11::ostringstream::~ostringstream(local_950);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_998 + 8),"Unable to find required file: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_7d8._8_8_);
          std::__cxx11::string::operator=
                    ((string *)&(this->TestResult).Output,(string *)(local_998 + 8));
          std::__cxx11::string::~string((string *)(local_998 + 8));
          std::__cxx11::string::clear();
          std::__cxx11::string::operator=
                    ((string *)&(this->TestResult).CompletionStatus,"Required Files Missing");
          (this->TestResult).Status = 0;
          return false;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) == 0) {
        cmCTest::CurrentTime_abi_cxx11_((string *)&timeout,this->CTest);
        std::__cxx11::string::operator=((string *)&this->StartTime,(string *)&timeout);
        std::__cxx11::string::~string((string *)&timeout);
        stop_time.__d.__r = (duration)(this->TestProperties->Timeout).__r;
        this->TimeoutIsForStopTime = false;
        local_b80.__d.__r = (duration)cmCTest::GetStopTime(this->CTest);
        std::chrono::
        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&stop_timeout);
        bVar3 = std::chrono::operator!=
                          (&local_b80,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)&stop_timeout);
        if (bVar3) {
          local_ba8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
          local_ba0.__r = (rep)std::chrono::operator-(&local_b80,&local_ba8);
          local_bb4 = 0x18;
          std::chrono::duration<long,std::ratio<3600l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<3600l,1l>> *)&local_bb0,&local_bb4);
          local_b98.__r = (rep)std::chrono::operator%(&local_ba0,&local_bb0);
          std::chrono::duration<double,std::ratio<1l,1l>>::
          duration<long,std::ratio<1l,1000000000l>,void>
                    ((duration<double,std::ratio<1l,1l>> *)&local_b90,&local_b98);
          local_bc0 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
          bVar3 = std::chrono::operator<=(&local_b90,&local_bc0);
          if (bVar3) {
            local_bc8 = (rep_conflict)std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
            local_b90 = (duration<double,_std::ratio<1L,_1L>_>)local_bc8;
          }
          local_bd0 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
          bVar3 = std::chrono::operator==
                            ((duration<double,_std::ratio<1L,_1L>_> *)&stop_time,&local_bd0);
          local_ce1 = true;
          if (!bVar3) {
            local_ce1 = std::chrono::operator<
                                  (&local_b90,(duration<double,_std::ratio<1L,_1L>_> *)&stop_time);
          }
          if (local_ce1 != false) {
            this->TimeoutIsForStopTime = true;
            stop_time.__d.__r = (duration)(duration)local_b90.__r;
          }
        }
        this_local._7_1_ =
             ForkProcess(this,(cmDuration)stop_time.__d.__r,
                         (bool)(this->TestProperties->ExplicitTimeout & 1),
                         &this->TestProperties->Environment,&this->TestProperties->Affinity);
      }
      else {
        std::make_unique<cmProcess,cmCTestRunTest&>((cmCTestRunTest *)local_998);
        std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator=
                  (&this->TestProcess,
                   (unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)local_998);
        std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
                  ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)local_998);
        poVar6 = std::operator<<(this->TestHandler->LogFile,"Unable to find executable: ");
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_00,1);
        poVar6 = std::operator<<(poVar6,(string *)pvVar9);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::ostringstream(local_b10);
        poVar6 = std::operator<<((ostream *)local_b10,"Unable to find executable: ");
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_00,1);
        poVar6 = std::operator<<(poVar6,(string *)pvVar9);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar2 = this->CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x209,pcVar7,false);
        std::__cxx11::string::~string(local_b30);
        std::__cxx11::ostringstream::~ostringstream(local_b10);
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_00,1);
        std::operator+(&local_b50,"Unable to find executable: ",pvVar9);
        std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)&local_b50);
        std::__cxx11::string::~string((string *)&local_b50);
        std::__cxx11::string::clear();
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).CompletionStatus,"Unable to find executable");
        (this->TestResult).Status = 0;
        this_local._7_1_ = false;
      }
    }
    else {
      pcVar1 = (cmCTestRunTest *)(&msg.field_2._M_allocated_capacity + 1);
      std::make_unique<cmProcess,cmCTestRunTest&>(pcVar1);
      std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator=
                (&this->TestProcess,(unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)pcVar1
                );
      std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
                ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)pcVar1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_408,"Failed test dependencies:",(allocator<char> *)((long)&__range2 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      __end2 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->FailedDependencies);
      failedDep = (string *)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(&this->FailedDependencies);
      while (bVar3 = std::operator!=(&__end2,(_Self *)&failedDep), bVar3) {
        local_430 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end2);
        std::operator+(&local_450," ",local_430);
        std::__cxx11::string::operator+=(local_408,(string *)&local_450);
        std::__cxx11::string::~string((string *)&local_450);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      poVar6 = std::operator<<(this->TestHandler->LogFile,local_408);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
      poVar6 = std::operator<<((ostream *)local_5c8,local_408);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar2 = this->CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                   ,0x1d3,pcVar7,false);
      std::__cxx11::string::~string((string *)&args);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c8);
      std::__cxx11::string::operator=((string *)&(this->TestResult).Output,local_408);
      std::__cxx11::string::clear();
      std::__cxx11::string::operator=
                ((string *)&(this->TestResult).CompletionStatus,"Fixture dependency failed");
      (this->TestResult).Status = 0;
      this_local._7_1_ = false;
      std::__cxx11::string::~string(local_408);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)&(this->TestResult).CompletionStatus,"Disabled");
    (this->TestResult).Status = 0;
    std::make_unique<cmProcess,cmCTestRunTest&>((cmCTestRunTest *)local_3e0);
    std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::operator=
              (&this->TestProcess,
               (unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)local_3e0);
    std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
              ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)local_3e0);
    std::__cxx11::string::operator=((string *)&(this->TestResult).Output,"Disabled");
    std::__cxx11::string::clear();
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t completed, size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::setw(2 * getNumWidth(total) + 8)
                 << "Start "
                 << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
                 << this->TestProperties->Index << ": "
                 << this->TestProperties->Name << std::endl);
  } else {
    std::string testName =
      GetTestPrefix(completed, total) + this->TestProperties->Name + "\n";
    cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, testName);
  }

  this->ProcessOutput.clear();

  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = cmDuration::zero();
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;

  // Return immediately if test is disabled
  if (this->TestProperties->Disabled) {
    this->TestResult.CompletionStatus = "Disabled";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    this->TestProcess = cm::make_unique<cmProcess>(*this);
    this->TestResult.Output = "Disabled";
    this->TestResult.FullCommandLine.clear();
    return false;
  }

  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;

  // Check for failed fixture dependencies before we even look at the command
  // arguments because if we are not going to run the test, the command and
  // its arguments are irrelevant. This matters for the case where a fixture
  // dependency might be creating the executable we want to run.
  if (!this->FailedDependencies.empty()) {
    this->TestProcess = cm::make_unique<cmProcess>(*this);
    std::string msg = "Failed test dependencies:";
    for (std::string const& failedDep : this->FailedDependencies) {
      msg += " " + failedDep;
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.CompletionStatus = "Fixture dependency failed";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  if (args.size() >= 2 && args[1] == "NOT_AVAILABLE") {
    this->TestProcess = cm::make_unique<cmProcess>(*this);
    std::string msg;
    if (this->CTest->GetConfigType().empty()) {
      msg = "Test not available without configuration.";
      msg += "  (Missing \"-C <config>\"?)";
    } else {
      msg = "Test not available in configuration \"";
      msg += this->CTest->GetConfigType();
      msg += "\".";
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.CompletionStatus = "Missing Configuration";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  // Check if all required files exist
  for (std::string const& file : this->TestProperties->RequiredFiles) {
    if (!cmSystemTools::FileExists(file)) {
      // Required file was not found
      this->TestProcess = cm::make_unique<cmProcess>(*this);
      *this->TestHandler->LogFile << "Unable to find required file: " << file
                                  << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to find required file: " << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine.clear();
      this->TestResult.CompletionStatus = "Required Files Missing";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
    }
  }
  // log and return if we did not find the executable
  if (this->ActualCommand.empty()) {
    // if the command was not found create a TestResult object
    // that has that information
    this->TestProcess = cm::make_unique<cmProcess>(*this);
    *this->TestHandler->LogFile << "Unable to find executable: " << args[1]
                                << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to find executable: " << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine.clear();
    this->TestResult.CompletionStatus = "Unable to find executable";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }
  this->StartTime = this->CTest->CurrentTime();

  auto timeout = this->TestProperties->Timeout;

  this->TimeoutIsForStopTime = false;
  std::chrono::system_clock::time_point stop_time = this->CTest->GetStopTime();
  if (stop_time != std::chrono::system_clock::time_point()) {
    std::chrono::duration<double> stop_timeout =
      (stop_time - std::chrono::system_clock::now()) % std::chrono::hours(24);

    if (stop_timeout <= std::chrono::duration<double>::zero()) {
      stop_timeout = std::chrono::duration<double>::zero();
    }
    if (timeout == std::chrono::duration<double>::zero() ||
        stop_timeout < timeout) {
      this->TimeoutIsForStopTime = true;
      timeout = stop_timeout;
    }
  }

  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment,
                           &this->TestProperties->Affinity);
}